

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

Hop_Obj_t * Abc_NodeIfToHop(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj)

{
  int iVar1;
  If_Cut_t *pIVar2;
  Hop_Obj_t *pData;
  If_Cut_t *pIVar3;
  bool bVar4;
  int local_44;
  If_Obj_t *pIStack_40;
  int i;
  If_Obj_t *pLeaf;
  Hop_Obj_t *gFunc;
  If_Cut_t *pCut;
  If_Obj_t *pIfObj_local;
  If_Man_t *pIfMan_local;
  Hop_Man_t *pHopMan_local;
  
  pIVar2 = If_ObjCutBest(pIfObj);
  if (1 < *(uint *)&pIVar2->field_0x1c >> 0x18) {
    local_44 = 0;
    while( true ) {
      bVar4 = false;
      if (local_44 < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
        pIStack_40 = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_44]);
        bVar4 = pIStack_40 != (If_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pIVar3 = If_ObjCutBest(pIStack_40);
      pData = Hop_IthVar(pHopMan,local_44);
      If_CutSetData(pIVar3,pData);
      local_44 = local_44 + 1;
    }
    Vec_PtrClear(pIfMan->vTemp);
    pHopMan_local = (Hop_Man_t *)Abc_NodeIfToHop2_rec(pHopMan,pIfMan,pIfObj,pIfMan->vTemp);
    if (pHopMan_local == (Hop_Man_t *)0x1) {
      printf("Abc_NodeIfToHop(): Computing local AIG has failed.\n");
      pHopMan_local = (Hop_Man_t *)0x0;
    }
    else {
      local_44 = 0;
      while( true ) {
        bVar4 = false;
        if (local_44 < (int)(*(uint *)&pIVar2->field_0x1c >> 0x18)) {
          pIStack_40 = If_ManObj(pIfMan,(int)(&pIVar2[1].Area)[local_44]);
          bVar4 = pIStack_40 != (If_Obj_t *)0x0;
        }
        if (!bVar4) break;
        pIVar3 = If_ObjCutBest(pIStack_40);
        If_CutSetData(pIVar3,(void *)0x0);
        local_44 = local_44 + 1;
      }
      for (local_44 = 0; iVar1 = Vec_PtrSize(pIfMan->vTemp), local_44 < iVar1;
          local_44 = local_44 + 1) {
        pIVar2 = (If_Cut_t *)Vec_PtrEntry(pIfMan->vTemp,local_44);
        If_CutSetData(pIVar2,(void *)0x0);
      }
    }
    return (Hop_Obj_t *)pHopMan_local;
  }
  __assert_fail("pCut->nLeaves > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIf.c"
                ,0x286,"Hop_Obj_t *Abc_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
}

Assistant:

Hop_Obj_t * Abc_NodeIfToHop( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc;
    If_Obj_t * pLeaf;
    int i;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), Hop_IthVar(pHopMan, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    gFunc = Abc_NodeIfToHop2_rec( pHopMan, pIfMan, pIfObj, pIfMan->vTemp ); 
    if ( gFunc == (void *)1 )
    {
        printf( "Abc_NodeIfToHop(): Computing local AIG has failed.\n" );
        return NULL;
    }
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), NULL );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetData( pCut, NULL );
    return gFunc;
}